

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O3

void __thiscall QHostInfoLookupManager::rescheduleWithMutexHeld(QHostInfoLookupManager *this)

{
  QList<QHostInfoRunnable_*> *this_00;
  QQueue<QHostInfoRunnable_*> *this_01;
  bool bVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  uint uVar6;
  int iVar7;
  int i;
  ulong uVar8;
  long in_FS_OFFSET;
  undefined1 local_44 [4];
  anon_class_8_1_54a39814_for__M_pred_conflict local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->wasDeleted == false) {
    if ((this->finishedLookups).d.size != 0) {
      uVar8 = 0;
      do {
        local_44 = (undefined1  [4])(this->finishedLookups).d.ptr[uVar8]->id;
        local_40.t = (int *)local_44;
        QtPrivate::
        sequential_erase_if<QList<int>,QtPrivate::sequential_erase<QList<int>,int>(QList<int>&,int_const&)::_lambda(auto:1_const&)_1_>
                  (&this->abortedLookups,&local_40);
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)(this->finishedLookups).d.size);
      QList<QHostInfoRunnable_*>::clear(&this->finishedLookups);
    }
    this_00 = &this->postponedLookups;
    iVar3 = QList<QHostInfoRunnable_*>::begin(this_00);
    iVar4 = QList<QHostInfoRunnable_*>::end(this_00);
    iVar5 = QList<QHostInfoRunnable_*>::begin(this_00);
    this_01 = &this->scheduledLookups;
    if (iVar3.i != iVar4.i) {
      do {
        bVar1 = rescheduleWithMutexHeld::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)(this->currentLookups).d.ptr,
                           (QHostInfoRunnable *)(this->currentLookups).d.size);
        if (bVar1) {
          *iVar5.i = *iVar3.i;
          iVar5.i = iVar5.i + 1;
        }
        else {
          local_40.t = (int *)*iVar3.i;
          QtPrivate::QPodArrayOps<QHostInfoRunnable*>::emplace<QHostInfoRunnable*&>
                    ((QPodArrayOps<QHostInfoRunnable*> *)this_01,0,(QHostInfoRunnable **)&local_40);
        }
        iVar3.i = iVar3.i + 1;
      } while (iVar3.i != iVar4.i);
    }
    iVar3 = QList<QHostInfoRunnable_*>::end(this_00);
    QList<QHostInfoRunnable_*>::erase(this_00,(const_iterator)iVar5.i,(const_iterator)iVar3.i);
    iVar3 = QList<QHostInfoRunnable_*>::begin(&this_01->super_QList<QHostInfoRunnable_*>);
    iVar4 = QList<QHostInfoRunnable_*>::end(&this_01->super_QList<QHostInfoRunnable_*>);
    iVar5 = QList<QHostInfoRunnable_*>::begin(&this_01->super_QList<QHostInfoRunnable_*>);
    if (iVar3.i != iVar4.i) {
      do {
        bVar1 = rescheduleWithMutexHeld::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)(this->currentLookups).d.ptr,
                           (QHostInfoRunnable *)(this->currentLookups).d.size);
        if (bVar1) {
          local_40.t = (int *)*iVar3.i;
          QtPrivate::QPodArrayOps<QHostInfoRunnable*>::emplace<QHostInfoRunnable*&>
                    ((QPodArrayOps<QHostInfoRunnable*> *)this_00,(this->postponedLookups).d.size,
                     (QHostInfoRunnable **)&local_40);
          QList<QHostInfoRunnable_*>::end(this_00);
        }
        else {
          *iVar5.i = *iVar3.i;
          iVar5.i = iVar5.i + 1;
        }
        iVar3.i = iVar3.i + 1;
      } while (iVar3.i != iVar4.i);
    }
    iVar3 = QList<QHostInfoRunnable_*>::end(&this_01->super_QList<QHostInfoRunnable_*>);
    QList<QHostInfoRunnable_*>::erase
              (&this_01->super_QList<QHostInfoRunnable_*>,(const_iterator)iVar5.i,
               (const_iterator)iVar3.i);
    iVar2 = QThreadPool::maxThreadCount();
    iVar7 = 1;
    if (1 < iVar2) {
      iVar7 = iVar2;
    }
    uVar6 = iVar7 - (int)(this->currentLookups).d.size;
    if (0 < (int)uVar6) {
      uVar8 = (this->scheduledLookups).super_QList<QHostInfoRunnable_*>.d.size;
      iVar3 = QList<QHostInfoRunnable_*>::begin(&this_01->super_QList<QHostInfoRunnable_*>);
      if (uVar8 != 0) {
        if (uVar8 < uVar6) {
          uVar6 = (uint)uVar8;
        }
        iVar7 = -uVar6;
        do {
          QThreadPool::start((QRunnable *)&this->threadPool,(int)*iVar3.i);
          local_40.t = (int *)*iVar3.i;
          QtPrivate::QPodArrayOps<QHostInfoRunnable*>::emplace<QHostInfoRunnable*&>
                    ((QPodArrayOps<QHostInfoRunnable*> *)&this->currentLookups,
                     (this->currentLookups).d.size,(QHostInfoRunnable **)&local_40);
          QList<QHostInfoRunnable_*>::end(&this->currentLookups);
          iVar3.i = iVar3.i + 1;
          iVar7 = iVar7 + 1;
        } while (iVar7 != 0);
      }
      iVar4 = QList<QHostInfoRunnable_*>::begin(&this_01->super_QList<QHostInfoRunnable_*>);
      QList<QHostInfoRunnable_*>::erase
                (&this_01->super_QList<QHostInfoRunnable_*>,(const_iterator)iVar4.i,
                 (const_iterator)iVar3.i);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHostInfoLookupManager::rescheduleWithMutexHeld()
{
    if (wasDeleted)
        return;

    // goals of this function:
    //  - launch new lookups via the thread pool
    //  - make sure only one lookup per host/IP is in progress

    if (!finishedLookups.isEmpty()) {
        // remove ID from aborted if it is in there
        for (int i = 0; i < finishedLookups.size(); i++) {
           abortedLookups.removeAll(finishedLookups.at(i)->id);
        }

        finishedLookups.clear();
    }

#if QT_CONFIG(thread)
    auto isAlreadyRunning = [this](QHostInfoRunnable *lookup) {
        return std::any_of(currentLookups.cbegin(), currentLookups.cend(), ToBeLookedUpEquals(lookup->toBeLookedUp));
    };

    // Transfer any postponed lookups that aren't currently running to the scheduled list, keeping already-running lookups:
    postponedLookups.erase(separate_if(postponedLookups.begin(),
                                       postponedLookups.end(),
                                       postponedLookups.begin(),
                                       std::front_inserter(scheduledLookups), // prepend! we want to finish it ASAP
                                       isAlreadyRunning).first,
                           postponedLookups.end());

    // Unschedule and postpone any that are currently running:
    scheduledLookups.erase(separate_if(scheduledLookups.begin(),
                                       scheduledLookups.end(),
                                       std::back_inserter(postponedLookups),
                                       scheduledLookups.begin(),
                                       isAlreadyRunning).second,
                           scheduledLookups.end());

    const int availableThreads = std::max(threadPool.maxThreadCount(), 1) - currentLookups.size();
    if (availableThreads > 0) {
        int readyToStartCount = qMin(availableThreads, scheduledLookups.size());
        auto it = scheduledLookups.begin();
        while (readyToStartCount--) {
            // runnable now running in new thread, track this in currentLookups
            threadPool.start(*it);
            currentLookups.push_back(std::move(*it));
            ++it;
        }
        scheduledLookups.erase(scheduledLookups.begin(), it);
    }
#else
    if (!scheduledLookups.isEmpty())
        scheduledLookups.takeFirst()->run();
#endif
}